

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3813::ShapeFunctionsDerivativeX
          (ChElementHexaANCF_3813 *this,ShapeVector *Nx,double x,double y,double z)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  
  dVar1 = y + 1.0;
  auVar3._8_8_ = dVar1;
  auVar3._0_8_ = dVar1;
  auVar3._16_8_ = dVar1;
  auVar3._24_8_ = dVar1;
  auVar4 = vpermi2pd_avx512f(_DAT_00997c00,ZEXT864((ulong)(1.0 - z)),
                             ZEXT1664(CONCAT88(z + 1.0,z + 1.0)));
  dVar1 = (2.0 / (this->m_InertFlexVec).m_data[0]) * 0.125;
  auVar6._8_8_ = dVar1;
  auVar6._0_8_ = dVar1;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = 1.0 - y;
  auVar9 = vunpcklpd_avx(auVar9,auVar6);
  auVar2._8_8_ = 0x8000000000000000;
  auVar2._0_8_ = 0x8000000000000000;
  auVar2 = vxorpd_avx512vl(auVar6,auVar2);
  auVar7._16_16_ = auVar2;
  auVar7._0_16_ = auVar9;
  auVar3 = vpermi2pd_avx512vl(_DAT_00998680,auVar7,auVar3);
  auVar7 = vpermpd_avx2(auVar7,0xd4);
  auVar8._0_8_ = auVar7._0_8_ * auVar3._0_8_;
  auVar8._8_8_ = auVar7._8_8_ * auVar3._8_8_;
  auVar8._16_8_ = auVar7._16_8_ * auVar3._16_8_;
  auVar8._24_8_ = auVar7._24_8_ * auVar3._24_8_;
  auVar5 = vinsertf64x4_avx512f(ZEXT3264(auVar8),auVar8,1);
  auVar4 = vmulpd_avx512f(auVar4,auVar5);
  *(undefined1 (*) [64])
   (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array =
       auVar4;
  return;
}

Assistant:

void ChElementHexaANCF_3813::ShapeFunctionsDerivativeX(ShapeVector& Nx, double x, double y, double z) {
    double a = GetLengthX();

    Nx(0) = 2.0 / a * 0.125 * (-1.0) * (1.0 - y) * (1.0 - z);
    Nx(1) = 2.0 / a * 0.125 * (1.0) * (1.0 - y) * (1.0 - z);
    Nx(2) = 2.0 / a * 0.125 * (1.0) * (1.0 + y) * (1.0 - z);
    Nx(3) = 2.0 / a * 0.125 * (-1.0) * (1.0 + y) * (1.0 - z);
    Nx(4) = 2.0 / a * 0.125 * (-1.0) * (1.0 - y) * (1.0 + z);
    Nx(5) = 2.0 / a * 0.125 * (1.0) * (1.0 - y) * (1.0 + z);
    Nx(6) = 2.0 / a * 0.125 * (1.0) * (1.0 + y) * (1.0 + z);
    Nx(7) = 2.0 / a * 0.125 * (-1.0) * (1.0 + y) * (1.0 + z);
}